

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

void __thiscall
amrex::StreamRetry::StreamRetry(StreamRetry *this,ostream *a_os,string *a_suffix,int a_maxtries)

{
  pos_type pVar1;
  
  this->tries = 0;
  this->maxTries = a_maxtries;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  this->sros = a_os;
  pVar1 = (pos_type)std::ostream::tellp();
  this->spos = pVar1;
  std::__cxx11::string::string((string *)&this->suffix,(string *)a_suffix);
  return;
}

Assistant:

amrex::StreamRetry::StreamRetry(std::ostream &a_os, const std::string &a_suffix,
                                 const int a_maxtries)
    : tries(0), maxTries(a_maxtries), sros(a_os), spos(a_os.tellp()), suffix(a_suffix)
{
}